

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createVarArg
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,IntrinsicInst *Inst)

{
  mapped_type *ppPVar1;
  Value *val;
  PSNode *n;
  PSNode *n_00;
  PSNode *op;
  PSNode *ptr;
  PSNode *vastart;
  PSNode *arg;
  Function *F;
  PSNode *local_58;
  PSNode *local_50;
  PSNode *local_48;
  PSNode *local_40;
  key_type local_38;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = *(key_type *)(*(long *)&Inst->field_0x28 + 0x38);
  ppPVar1 = std::__detail::
            _Map_base<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this + 0x1c0),&local_38);
  local_40 = (*ppPVar1)->vararg;
  local_48 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  val = (Value *)llvm::Value::stripInBoundsOffsets
                           (*(undefined8 *)
                             ((long)Inst - (ulong)(uint)(*(int *)&Inst->field_0x14 << 5)),
                            llvm::function_ref<void(llvm::Value_const*)>::
                            callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                            ,&local_58);
  local_58 = getOperand(this,val);
  local_50 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,&local_58,&Offset::UNKNOWN);
  n = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                ((PointerGraph *)this,&local_48,&local_50);
  n_00 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                   ((PointerGraph *)this,&local_40,&local_48);
  PSNodesSeq::append(__return_storage_ptr__,local_48);
  PSNodesSeq::append(__return_storage_ptr__,local_50);
  PSNodesSeq::append(__return_storage_ptr__,n);
  PSNodesSeq::append(__return_storage_ptr__,n_00);
  __return_storage_ptr__->_repr = local_48;
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createVarArg(const llvm::IntrinsicInst *Inst) {
    // just store all the pointers from vararg argument
    // to the memory given in vastart() on Offset::UNKNOWN.
    // It is the easiest thing we can do without any further
    // analysis
    PSNodesSeq ret;

    // first we need to get the vararg argument phi
    const llvm::Function *F = Inst->getParent()->getParent();
    PointerSubgraph *subg = subgraphs_map[F];
    assert(subg);
    PSNode *arg = subg->vararg;
    assert(F->isVarArg() && "vastart in a non-variadic function");
    assert(arg && "Don't have variadic argument in a variadic function");

    // vastart will be node that will keep the memory
    // with pointers, its argument is the alloca, that
    // alloca will keep pointer to vastart
    PSNode *vastart = PS.create<PSNodeType::ALLOC>();

    // vastart has only one operand which is the struct
    // it uses for storing the va arguments. Strip it so that we'll
    // get the underlying alloca inst
    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // the argument is usually an alloca, but it may be a load
    // in the case the code was transformed by -reg2mem
    assert((op->getType() == PSNodeType::ALLOC ||
            op->getType() == PSNodeType::LOAD) &&
           "Argument of vastart is invalid");
    // get node with the same pointer, but with Offset::UNKNOWN
    // FIXME: we're leaking it
    // make the memory in alloca point to our memory in vastart
    PSNode *ptr = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S1 = PS.create<PSNodeType::STORE>(vastart, ptr);
    // and also make vastart point to the vararg args
    PSNode *S2 = PS.create<PSNodeType::STORE>(arg, vastart);

    ret.append(vastart);
    ret.append(ptr);
    ret.append(S1);
    ret.append(S2);

    ret.setRepresentant(vastart);

    return ret;
}